

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void instantiate(ecs_world_t *world,ecs_entity_t base,ecs_table_t *table,ecs_data_t *data,
                int32_t row,int32_t count)

{
  int32_t iVar1;
  ecs_vector_t *vector;
  void *pvVar2;
  ecs_table_t **child_table_ptr;
  ecs_table_t **child_table_ptr_array;
  int child_table_ptr_count;
  int child_table_ptr_i;
  ecs_vector_t *child_tables;
  int32_t count_local;
  int32_t row_local;
  ecs_data_t *data_local;
  ecs_table_t *table_local;
  ecs_entity_t base_local;
  ecs_world_t *world_local;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,base);
  if (vector != (ecs_vector_t *)0x0) {
    iVar1 = ecs_vector_count(vector);
    pvVar2 = _ecs_vector_first(vector,8,0x10);
    for (child_table_ptr_array._4_4_ = 0; child_table_ptr_array._4_4_ < iVar1;
        child_table_ptr_array._4_4_ = child_table_ptr_array._4_4_ + 1) {
      instantiate_children
                (world,base,table,data,row,count,
                 *(ecs_table_t **)((long)pvVar2 + (long)child_table_ptr_array._4_4_ * 8));
    }
  }
  return;
}

Assistant:

static
void instantiate(
    ecs_world_t * world,
    ecs_entity_t base,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count)
{    
    /* If base is a parent, instantiate children of base for instances */

    ecs_vector_t *child_tables = ecs_map_get_ptr(
        world->child_tables, ecs_vector_t*, base);

    if (child_tables) {
        ecs_vector_each(child_tables, ecs_table_t*, child_table_ptr, {
            instantiate_children(
                world, base, table, data, row, count, *child_table_ptr);
        });
    }
}